

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManCreateRefs(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  uint *puVar5;
  int *piVar6;
  size_t sVar7;
  uint uVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  size_t __nmemb;
  
  if (p->pRefs != (int *)0x0) {
    __assert_fail("p->pRefs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x2d0,"void Gia_ManCreateRefs(Gia_Man_t *)");
  }
  iVar3 = p->nObjs;
  __nmemb = (size_t)iVar3;
  piVar6 = (int *)calloc(__nmemb,4);
  p->pRefs = piVar6;
  if ((0 < (long)__nmemb) && (pGVar4 = p->pObjs, pGVar4 != (Gia_Obj_t *)0x0)) {
    pGVar1 = pGVar4 + __nmemb;
    sVar7 = 0;
    do {
      pGVar9 = pGVar4 + sVar7;
      iVar11 = (int)*(ulong *)pGVar9;
      uVar10 = *(ulong *)pGVar9 & 0x1fffffff;
      if (uVar10 == 0x1fffffff || iVar11 < 0) {
        if (iVar11 < 0 && (int)uVar10 != 0x1fffffff) {
          pGVar9 = pGVar9 + -uVar10;
LAB_00240117:
          if ((pGVar9 < pGVar4) || (pGVar1 <= pGVar9)) {
LAB_0024014d:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          piVar6[(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555] =
               piVar6[(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555] + 1;
        }
      }
      else {
        pGVar2 = pGVar9 + -uVar10;
        if ((pGVar2 < pGVar4) || (pGVar1 <= pGVar2)) goto LAB_0024014d;
        piVar6[(int)((ulong)((long)pGVar2 - (long)pGVar4) >> 2) * -0x55555555] =
             piVar6[(int)((ulong)((long)pGVar2 - (long)pGVar4) >> 2) * -0x55555555] + 1;
        uVar12 = (uint)*(ulong *)pGVar9;
        uVar8 = (uint)(*(ulong *)pGVar9 >> 0x20);
        if (((int)uVar12 < 0) ||
           ((uVar12 = uVar12 & 0x1fffffff, uVar12 == 0x1fffffff || (uVar12 != (uVar8 & 0x1fffffff)))
           )) {
          pGVar9 = pGVar9 + -(ulong)(uVar8 & 0x1fffffff);
          if ((pGVar9 < pGVar4) || (pGVar1 <= pGVar9)) goto LAB_0024014d;
          piVar6[(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555] =
               piVar6[(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555] + 1;
        }
        puVar5 = p->pMuxes;
        if ((puVar5 != (uint *)0x0) && (puVar5[sVar7] != 0)) {
          if (puVar5 == (uint *)0x0) {
            pGVar9 = (Gia_Obj_t *)0x0;
          }
          else {
            if ((int)puVar5[sVar7] < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar8 = puVar5[sVar7] >> 1;
            if (iVar3 <= (int)uVar8) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            pGVar9 = pGVar4 + uVar8;
          }
          goto LAB_00240117;
        }
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 != __nmemb);
  }
  return;
}

Assistant:

void Gia_ManCreateRefs( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pRefs == NULL );
    p->pRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjRefFanin0Inc( p, pObj );
            if ( !Gia_ObjIsBuf(pObj) )
                Gia_ObjRefFanin1Inc( p, pObj );
            if ( Gia_ObjIsMuxId(p, i) )
                Gia_ObjRefFanin2Inc( p, pObj );
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjRefFanin0Inc( p, pObj );
    }
}